

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::
insert<kj::_::(anonymous_namespace)::SiPair,char_const(&)[6]>
          (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this,
          ArrayPtr<kj::_::(anonymous_namespace)::SiPair> table,size_t pos,char (*params) [7])

{
  SiPair a;
  ArrayPtr<kj::_::(anonymous_namespace)::SiPair> table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  SiPair *pSVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this_00;
  char *in_R9;
  Maybe<unsigned_long> MVar7;
  ulong local_d0;
  ArrayPtr<const_char> local_c8;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *local_b8;
  SiPair *local_b0;
  char *local_a8;
  size_t local_a0;
  undefined8 local_98;
  HashBucket local_88;
  HashBucket local_80;
  HashBucket *local_78;
  HashBucket *s;
  HashBucket *_s944;
  HashBucket *bucket;
  uint i;
  Maybe<kj::_::HashBucket_&> erasedSlot;
  uint hashCode;
  char (*params_local) [7];
  size_t pos_local;
  HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this_local;
  ArrayPtr<kj::_::(anonymous_namespace)::SiPair> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)table.size_;
  this_00 = (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)table.ptr;
  table_local.ptr = (SiPair *)pos;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
  sVar4 = ArrayPtr<kj::_::(anonymous_namespace)::SiPair>::size
                    ((ArrayPtr<kj::_::(anonymous_namespace)::SiPair> *)&this_local);
  if (sVar3 << 1 < (sVar4 + 1 + this_00->erasedCount) * 3) {
    sVar3 = ArrayPtr<kj::_::(anonymous_namespace)::SiPair>::size
                      ((ArrayPtr<kj::_::(anonymous_namespace)::SiPair> *)&this_local);
    rehash(this_00,(sVar3 + 1) * 3);
  }
  StringPtr::StringPtr((StringPtr *)&erasedSlot,in_R9);
  uVar2 = kj::_::anon_unknown_0::SiPairStringHasher::hashCode
                    ((SiPairStringHasher *)this_00,(StringPtr)_erasedSlot);
  Maybe<kj::_::HashBucket_&>::Maybe((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
  sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
  bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
  do {
    _s944 = Array<kj::_::HashBucket>::operator[](&this_00->buckets,(ulong)bucket._4_4_);
    bVar1 = kj::_::HashBucket::isEmpty(_s944);
    if (bVar1) {
      s = kj::_::readMaybe<kj::_::HashBucket>
                    ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
      if (s == (HashBucket *)0x0) {
        kj::_::HashBucket::HashBucket(&local_88,uVar2,(uint)params);
        *_s944 = local_88;
      }
      else {
        this_00->erasedCount = this_00->erasedCount - 1;
        local_78 = s;
        kj::_::HashBucket::HashBucket(&local_80,uVar2,(uint)params);
        *local_78 = local_80;
      }
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
      aVar6 = extraout_RDX;
LAB_00200baa:
      MVar7.ptr.field_1.value = aVar6.value;
      MVar7.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar7.ptr;
    }
    bVar1 = kj::_::HashBucket::isErased(_s944);
    if (bVar1) {
      bVar1 = Maybe<kj::_::HashBucket_&>::operator==
                        ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
      if (bVar1) {
        Maybe<kj::_::HashBucket_&>::operator=
                  ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8,_s944);
      }
    }
    else if (_s944->hash == uVar2) {
      local_b8 = this_local;
      local_b0 = table_local.ptr;
      table_00.size_ = (size_t)table_local.ptr;
      table_00.ptr = (SiPair *)this_local;
      pSVar5 = kj::_::HashBucket::getRow<kj::_::(anonymous_namespace)::SiPair>(_s944,table_00);
      local_a8 = (pSVar5->str).content.ptr;
      local_a0 = (pSVar5->str).content.size_;
      local_98 = *(undefined8 *)&pSVar5->i;
      StringPtr::StringPtr((StringPtr *)&local_c8,in_R9);
      a.str.content.size_ = local_a0;
      a.str.content.ptr = local_a8;
      a._16_8_ = local_98;
      bVar1 = kj::_::anon_unknown_0::SiPairStringHasher::matches
                        ((SiPairStringHasher *)this_00,a,(StringPtr)local_c8);
      if (bVar1) {
        uVar2 = kj::_::HashBucket::getPos(_s944);
        local_d0 = (ulong)uVar2;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_d0);
        aVar6 = extraout_RDX_00;
        goto LAB_00200baa;
      }
    }
    sVar3 = kj::_::probeHash(&this_00->buckets,(ulong)bucket._4_4_);
    bucket._4_4_ = (uint)sVar3;
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }